

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O0

void doDecodeTile(exr_context_t f,pixels *p,int xs,int ys)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  long lVar5;
  ostream *this;
  int in_ECX;
  int in_EDX;
  undefined8 in_RDI;
  exr_result_t _test_rv_7;
  exr_result_t _test_rv_6;
  exr_result_t _test_rv_5;
  int32_t linestride;
  int32_t pixelstride;
  void *ptr;
  exr_coding_channel_info_t *curchan;
  int c;
  int32_t idxoffset;
  exr_result_t _test_rv_4;
  exr_result_t _test_rv_3;
  exr_result_t _test_rv_2;
  exr_result_t _test_rv_1;
  exr_result_t _test_rv;
  bool first;
  exr_decode_pipeline_t decoder;
  exr_chunk_info_t cinfo;
  int endx;
  int x;
  int endy;
  int y;
  int32_t tiley;
  int32_t tilex;
  int32_t tileh;
  int32_t tilew;
  int32_t tlevy;
  int32_t tlevx;
  int32_t *in_stack_fffffffffffffce8;
  int32_t *in_stack_fffffffffffffcf0;
  uint line;
  ostream *in_stack_fffffffffffffcf8;
  ostream *in_stack_fffffffffffffd00;
  exr_coding_channel_info_t *in_stack_fffffffffffffd08;
  pixels *in_stack_fffffffffffffd10;
  undefined4 local_2b0;
  int local_2ac;
  undefined8 local_2a8;
  int local_298;
  undefined1 local_278 [8];
  long local_270;
  short local_268;
  int32_t local_80 [16];
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  undefined8 local_8;
  
  bVar1 = true;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_8 = in_RDI;
  if (in_EDX != 1 || in_ECX != 1) {
    core_test_fail((char *)in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                   (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                   (char *)in_stack_fffffffffffffce8);
  }
  iVar2 = exr_get_tile_levels(local_8,0,&local_1c,&local_20);
  if (iVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                   (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                   (char *)in_stack_fffffffffffffce8);
  }
  if (local_1c != 1 || local_20 != 1) {
    core_test_fail((char *)in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                   (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                   (char *)in_stack_fffffffffffffce8);
  }
  iVar2 = exr_get_tile_sizes(local_8,0,0,0,&local_24,&local_28);
  if (iVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                   (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                   (char *)in_stack_fffffffffffffce8);
  }
  if (local_24 != 0x20 || local_28 != 0x20) {
    core_test_fail((char *)in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                   (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                   (char *)in_stack_fffffffffffffce8);
  }
  local_38 = local_18 * 0xbc;
  local_30 = 0;
  for (local_34 = local_18 * 0x1d; local_34 < local_38; local_34 = local_28 + local_34) {
    local_2c = 0;
    local_40 = local_14 * 0x56c;
    for (local_3c = local_14 * 0x11; local_3c < local_40; local_3c = local_24 + local_3c) {
      in_stack_fffffffffffffce8 = local_80;
      iVar2 = exr_read_tile_chunk_info(local_8,0,local_2c,local_30,0);
      if (iVar2 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar2);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        core_test_fail((char *)in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                       (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                       (char *)in_stack_fffffffffffffce8);
      }
      if (bVar1) {
        iVar2 = exr_decoding_initialize(local_8,0,local_80,local_278);
        if (iVar2 != 0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
          in_stack_fffffffffffffd10 = (pixels *)std::operator<<(poVar3,") ");
          pcVar4 = (char *)exr_get_default_error_message(iVar2);
          poVar3 = std::operator<<((ostream *)in_stack_fffffffffffffd10,pcVar4);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          core_test_fail((char *)in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                         (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                         (char *)in_stack_fffffffffffffce8);
        }
      }
      else {
        iVar2 = exr_decoding_update(local_8,0,local_80,local_278);
        if (iVar2 != 0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
          in_stack_fffffffffffffd08 = (exr_coding_channel_info_t *)std::operator<<(poVar3,") ");
          pcVar4 = (char *)exr_get_default_error_message(iVar2);
          poVar3 = std::operator<<((ostream *)in_stack_fffffffffffffd08,pcVar4);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          core_test_fail((char *)in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                         (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                         (char *)in_stack_fffffffffffffce8);
        }
      }
      for (local_298 = 0; local_298 < local_268; local_298 = local_298 + 1) {
        lVar5 = local_270 + (long)local_298 * 0x30;
        fill_pointers(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
                      (int32_t)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                      (void **)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                      in_stack_fffffffffffffce8);
        if (*(short *)(lVar5 + 0x1c) != local_2ac) {
          core_test_fail((char *)in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                         (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                         (char *)in_stack_fffffffffffffce8);
        }
        *(undefined8 *)(local_270 + (long)local_298 * 0x30 + 0x28) = local_2a8;
        *(int *)(local_270 + (long)local_298 * 0x30 + 0x20) = local_2ac;
        *(undefined4 *)(local_270 + (long)local_298 * 0x30 + 0x24) = local_2b0;
      }
      if ((bVar1) && (iVar2 = exr_decoding_choose_default_routines(local_8,0,local_278), iVar2 != 0)
         ) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
        in_stack_fffffffffffffd00 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar2);
        poVar3 = std::operator<<(in_stack_fffffffffffffd00,pcVar4);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        core_test_fail((char *)in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                       (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                       (char *)in_stack_fffffffffffffce8);
      }
      iVar2 = exr_decoding_run(local_8,0,local_278);
      if (iVar2 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
        in_stack_fffffffffffffcf8 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar2);
        poVar3 = std::operator<<(in_stack_fffffffffffffcf8,pcVar4);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        core_test_fail((char *)in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                       (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                       (char *)in_stack_fffffffffffffce8);
      }
      bVar1 = false;
      local_2c = local_2c + 1;
    }
    local_30 = local_30 + 1;
  }
  iVar2 = exr_decoding_destroy(local_8,local_278);
  if (iVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar2);
    this = std::operator<<(poVar3,pcVar4);
    line = (uint)((ulong)poVar3 >> 0x20);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,line,
                   (char *)in_stack_fffffffffffffce8);
  }
  return;
}

Assistant:

static void
doDecodeTile (exr_context_t f, pixels& p, int xs, int ys)
{
    int32_t               tlevx, tlevy;
    int32_t               tilew, tileh;
    int32_t               tilex, tiley;
    int                   y, endy;
    int                   x, endx;
    exr_chunk_info_t      cinfo;
    exr_decode_pipeline_t decoder;
    bool                  first = true;

    EXRCORE_TEST (xs == 1 && ys == 1);
    EXRCORE_TEST_RVAL (exr_get_tile_levels (f, 0, &tlevx, &tlevy));
    EXRCORE_TEST (tlevx == 1 && tlevy == 1);

    EXRCORE_TEST_RVAL (exr_get_tile_sizes (f, 0, 0, 0, &tilew, &tileh));
    EXRCORE_TEST (tilew == 32 && tileh == 32);

    y     = IMG_DATA_Y * ys;
    endy  = y + IMG_HEIGHT * ys;
    tiley = 0;
    for (; y < endy; y += tileh, ++tiley)
    {
        tilex = 0;

        x    = IMG_DATA_X * xs;
        endx = x + IMG_WIDTH * xs;
        for (; x < endx; x += tilew, ++tilex)
        {
            EXRCORE_TEST_RVAL (
                exr_read_tile_chunk_info (f, 0, tilex, tiley, 0, 0, &cinfo));
            if (first)
            {
                EXRCORE_TEST_RVAL (
                    exr_decoding_initialize (f, 0, &cinfo, &decoder));
            }
            else
            {
                EXRCORE_TEST_RVAL (
                    exr_decoding_update (f, 0, &cinfo, &decoder));
            }

            int32_t idxoffset = tiley * tileh * p._stride_x + tilex * tilew;

            for (int c = 0; c < decoder.channel_count; ++c)
            {
                const exr_coding_channel_info_t& curchan = decoder.channels[c];
                void*                            ptr;
                int32_t                          pixelstride;
                int32_t                          linestride;

                fill_pointers (
                    p, curchan, idxoffset, &ptr, &pixelstride, &linestride);

                // make sure the setup has initialized our bytes for us
                EXRCORE_TEST (curchan.user_bytes_per_element == pixelstride);

                decoder.channels[c].decode_to_ptr     = (uint8_t*) ptr;
                decoder.channels[c].user_pixel_stride = pixelstride;
                decoder.channels[c].user_line_stride  = linestride;
            }

            if (first)
            {
                EXRCORE_TEST_RVAL (
                    exr_decoding_choose_default_routines (f, 0, &decoder));
            }
            EXRCORE_TEST_RVAL (exr_decoding_run (f, 0, &decoder));
            first = false;
        }
    }
    EXRCORE_TEST_RVAL (exr_decoding_destroy (f, &decoder));
}